

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::Embed::~Embed(Embed *this)

{
  std::
  unique_ptr<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>,_std::default_delete<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>_>
  ::~unique_ptr(&(this->fields).
                 super_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>
                 .t_);
  std::unique_ptr<discordpp::EmbedAuthor,_std::default_delete<discordpp::EmbedAuthor>_>::~unique_ptr
            (&(this->author).super_field<discordpp::EmbedAuthor>.t_);
  std::unique_ptr<discordpp::EmbedProvider,_std::default_delete<discordpp::EmbedProvider>_>::
  ~unique_ptr(&(this->provider).super_field<discordpp::EmbedProvider>.t_);
  std::unique_ptr<discordpp::EmbedVideo,_std::default_delete<discordpp::EmbedVideo>_>::~unique_ptr
            (&(this->video).super_field<discordpp::EmbedVideo>.t_);
  std::unique_ptr<discordpp::EmbedThumbnail,_std::default_delete<discordpp::EmbedThumbnail>_>::
  ~unique_ptr(&(this->thumbnail).super_field<discordpp::EmbedThumbnail>.t_);
  std::unique_ptr<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>::~unique_ptr
            (&(this->image).super_field<discordpp::EmbedImage>.t_);
  std::unique_ptr<discordpp::EmbedFooter,_std::default_delete<discordpp::EmbedFooter>_>::~unique_ptr
            (&(this->footer).super_field<discordpp::EmbedFooter>.t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->color).super_field<int>.t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->timestamp).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->url).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->description).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->type).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->title).
                 super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .t_);
  return;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}